

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O3

bool __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::read_from_stream
          (array_n<float,_3,_std::allocator<float>_> *this,ifstream *stream)

{
  bool bVar1;
  int i;
  long lVar2;
  uint sig;
  uint _in_dims [3];
  int local_28;
  uint local_24 [3];
  
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) {
    return false;
  }
  local_28 = 0;
  std::istream::read((char *)stream,(long)&local_28);
  if (local_28 == 0x53534c41) {
    std::istream::read((char *)stream,(long)local_24);
    lVar2 = 0;
    do {
      if (local_24[lVar2] != this->_dims[lVar2]) goto LAB_00146d60;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    std::istream::read((char *)stream,(long)this->_array);
    bVar1 = true;
  }
  else {
LAB_00146d60:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 1;

            stream.read((char *)&sig, sizeof(unsigned int));

            if(sig != 0x53534c41) return false;
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));

            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
                size *= _dims[i];
            }

            stream.read((char *)_array, size*sizeof(T));
            return true;
        }